

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_2d_avx2.h
# Opt level: O3

void convolve_2d_sr_hor_8tap_avx2
               (uint8_t *src,int32_t src_stride,int32_t w,int32_t h,
               InterpFilterParams *filter_params_x,int32_t subpel_x_q4,int16_t *im_block)

{
  undefined1 auVar1 [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  
  auVar7 = vpsraw_avx(*(undefined1 (*) [16])
                       (filter_params_x->filter_ptr +
                       (subpel_x_q4 & 0xfU) * (uint)filter_params_x->taps),1);
  auVar1 = vpshufb_avx(auVar7,_DAT_00561f00);
  auVar4._0_2_ = auVar1._0_2_;
  auVar4._2_2_ = auVar4._0_2_;
  auVar4._4_2_ = auVar4._0_2_;
  auVar4._6_2_ = auVar4._0_2_;
  auVar4._8_2_ = auVar4._0_2_;
  auVar4._10_2_ = auVar4._0_2_;
  auVar4._12_2_ = auVar4._0_2_;
  auVar4._14_2_ = auVar4._0_2_;
  auVar4._16_2_ = auVar4._0_2_;
  auVar4._18_2_ = auVar4._0_2_;
  auVar4._20_2_ = auVar4._0_2_;
  auVar4._22_2_ = auVar4._0_2_;
  auVar4._24_2_ = auVar4._0_2_;
  auVar4._26_2_ = auVar4._0_2_;
  auVar4._28_2_ = auVar4._0_2_;
  auVar4._30_2_ = auVar4._0_2_;
  auVar1 = vpshufb_avx(auVar7,_DAT_00561e60);
  auVar5._0_2_ = auVar1._0_2_;
  auVar5._2_2_ = auVar5._0_2_;
  auVar5._4_2_ = auVar5._0_2_;
  auVar5._6_2_ = auVar5._0_2_;
  auVar5._8_2_ = auVar5._0_2_;
  auVar5._10_2_ = auVar5._0_2_;
  auVar5._12_2_ = auVar5._0_2_;
  auVar5._14_2_ = auVar5._0_2_;
  auVar5._16_2_ = auVar5._0_2_;
  auVar5._18_2_ = auVar5._0_2_;
  auVar5._20_2_ = auVar5._0_2_;
  auVar5._22_2_ = auVar5._0_2_;
  auVar5._24_2_ = auVar5._0_2_;
  auVar5._26_2_ = auVar5._0_2_;
  auVar5._28_2_ = auVar5._0_2_;
  auVar5._30_2_ = auVar5._0_2_;
  auVar1 = vpshufb_avx(auVar7,_DAT_00561e70);
  auVar6._0_2_ = auVar1._0_2_;
  auVar6._2_2_ = auVar6._0_2_;
  auVar6._4_2_ = auVar6._0_2_;
  auVar6._6_2_ = auVar6._0_2_;
  auVar6._8_2_ = auVar6._0_2_;
  auVar6._10_2_ = auVar6._0_2_;
  auVar6._12_2_ = auVar6._0_2_;
  auVar6._14_2_ = auVar6._0_2_;
  auVar6._16_2_ = auVar6._0_2_;
  auVar6._18_2_ = auVar6._0_2_;
  auVar6._20_2_ = auVar6._0_2_;
  auVar6._22_2_ = auVar6._0_2_;
  auVar6._24_2_ = auVar6._0_2_;
  auVar6._26_2_ = auVar6._0_2_;
  auVar6._28_2_ = auVar6._0_2_;
  auVar6._30_2_ = auVar6._0_2_;
  auVar1 = vpshufb_avx(auVar7,_DAT_00561f10);
  auVar8._0_2_ = auVar1._0_2_;
  auVar8._2_2_ = auVar8._0_2_;
  auVar8._4_2_ = auVar8._0_2_;
  auVar8._6_2_ = auVar8._0_2_;
  auVar8._8_2_ = auVar8._0_2_;
  auVar8._10_2_ = auVar8._0_2_;
  auVar8._12_2_ = auVar8._0_2_;
  auVar8._14_2_ = auVar8._0_2_;
  auVar8._16_2_ = auVar8._0_2_;
  auVar8._18_2_ = auVar8._0_2_;
  auVar8._20_2_ = auVar8._0_2_;
  auVar8._22_2_ = auVar8._0_2_;
  auVar8._24_2_ = auVar8._0_2_;
  auVar8._26_2_ = auVar8._0_2_;
  auVar8._28_2_ = auVar8._0_2_;
  auVar8._30_2_ = auVar8._0_2_;
  switch(w << 0x1d | w - 8U >> 3) {
  case 0:
    pauVar2 = (undefined1 (*) [16])(src + -3);
    auVar9._16_16_ = _DAT_0050da40;
    auVar9._0_16_ = _DAT_0050da40;
    auVar12._16_16_ = _DAT_0050d620;
    auVar12._0_16_ = _DAT_0050d620;
    auVar17._16_16_ = _DAT_0050d630;
    auVar17._0_16_ = _DAT_0050d630;
    auVar20._16_16_ = _DAT_0050e470;
    auVar20._0_16_ = _DAT_0050e470;
    auVar25._8_2_ = 2;
    auVar25._0_8_ = 0x2000200020002;
    auVar25._10_2_ = 2;
    auVar25._12_2_ = 2;
    auVar25._14_2_ = 2;
    auVar25._16_2_ = 2;
    auVar25._18_2_ = 2;
    auVar25._20_2_ = 2;
    auVar25._22_2_ = 2;
    auVar25._24_2_ = 2;
    auVar25._26_2_ = 2;
    auVar25._28_2_ = 2;
    auVar25._30_2_ = 2;
    do {
      auVar30._0_16_ =
           ZEXT116(0) * *(undefined1 (*) [16])(*pauVar2 + src_stride) + ZEXT116(1) * *pauVar2;
      auVar30._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
           ZEXT116(1) * *(undefined1 (*) [16])(*pauVar2 + src_stride);
      auVar36 = vpshufb_avx2(auVar30,auVar9);
      auVar15 = vpshufb_avx2(auVar30,auVar12);
      auVar33 = vpshufb_avx2(auVar30,auVar17);
      auVar23 = vpshufb_avx2(auVar30,auVar20);
      auVar36 = vpmaddubsw_avx2(auVar36,auVar4);
      auVar15 = vpmaddubsw_avx2(auVar15,auVar5);
      auVar36 = vpaddw_avx2(auVar36,auVar15);
      auVar15 = vpmaddubsw_avx2(auVar33,auVar6);
      auVar33 = vpmaddubsw_avx2(auVar23,auVar8);
      auVar15 = vpaddw_avx2(auVar15,auVar33);
      auVar36 = vpaddw_avx2(auVar36,auVar15);
      auVar36 = vpaddw_avx2(auVar36,auVar25);
      auVar36 = vpsraw_avx2(auVar36,2);
      *(undefined1 (*) [32])im_block = auVar36;
      pauVar2 = (undefined1 (*) [16])(*pauVar2 + src_stride * 2);
      im_block = (int16_t *)((long)im_block + 0x20);
      h = h + -2;
    } while (h != 0);
    break;
  case 1:
    pauVar2 = (undefined1 (*) [16])(src + 5);
    auVar10._16_16_ = _DAT_0050da40;
    auVar10._0_16_ = _DAT_0050da40;
    auVar14._16_16_ = _DAT_0050d620;
    auVar14._0_16_ = _DAT_0050d620;
    auVar18._16_16_ = _DAT_0050d630;
    auVar18._0_16_ = _DAT_0050d630;
    auVar22._16_16_ = _DAT_0050e470;
    auVar22._0_16_ = _DAT_0050e470;
    auVar27._8_2_ = 2;
    auVar27._0_8_ = 0x2000200020002;
    auVar27._10_2_ = 2;
    auVar27._12_2_ = 2;
    auVar27._14_2_ = 2;
    auVar27._16_2_ = 2;
    auVar27._18_2_ = 2;
    auVar27._20_2_ = 2;
    auVar27._22_2_ = 2;
    auVar27._24_2_ = 2;
    auVar27._26_2_ = 2;
    auVar27._28_2_ = 2;
    auVar27._30_2_ = 2;
    do {
      auVar31._0_16_ =
           ZEXT116(0) * *(undefined1 (*) [16])(pauVar2[-1] + (long)src_stride + 8) +
           ZEXT116(1) * *(undefined1 (*) [16])(pauVar2[-1] + 8);
      auVar31._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
           ZEXT116(1) * *(undefined1 (*) [16])(pauVar2[-1] + (long)src_stride + 8);
      auVar36 = vpshufb_avx2(auVar31,auVar10);
      auVar15 = vpshufb_avx2(auVar31,auVar14);
      auVar33 = vpshufb_avx2(auVar31,auVar18);
      auVar23 = vpshufb_avx2(auVar31,auVar22);
      auVar36 = vpmaddubsw_avx2(auVar36,auVar4);
      auVar15 = vpmaddubsw_avx2(auVar15,auVar5);
      auVar36 = vpaddw_avx2(auVar36,auVar15);
      auVar15 = vpmaddubsw_avx2(auVar33,auVar6);
      auVar33 = vpmaddubsw_avx2(auVar23,auVar8);
      auVar15 = vpaddw_avx2(auVar15,auVar33);
      auVar36 = vpaddw_avx2(auVar36,auVar15);
      auVar34._0_16_ =
           ZEXT116(0) * *(undefined1 (*) [16])(*pauVar2 + src_stride) + ZEXT116(1) * *pauVar2;
      auVar34._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
           ZEXT116(1) * *(undefined1 (*) [16])(*pauVar2 + src_stride);
      auVar15 = vpshufb_avx2(auVar34,auVar10);
      auVar33 = vpshufb_avx2(auVar34,auVar14);
      auVar23 = vpshufb_avx2(auVar34,auVar18);
      auVar28 = vpshufb_avx2(auVar34,auVar22);
      auVar15 = vpmaddubsw_avx2(auVar15,auVar4);
      auVar33 = vpmaddubsw_avx2(auVar33,auVar5);
      auVar15 = vpaddw_avx2(auVar15,auVar33);
      auVar33 = vpmaddubsw_avx2(auVar23,auVar6);
      auVar23 = vpmaddubsw_avx2(auVar28,auVar8);
      auVar33 = vpaddw_avx2(auVar33,auVar23);
      auVar15 = vpaddw_avx2(auVar15,auVar33);
      auVar36 = vpaddw_avx2(auVar36,auVar27);
      auVar15 = vpaddw_avx2(auVar15,auVar27);
      auVar37._0_16_ = ZEXT116(0) * auVar15._0_16_ + ZEXT116(1) * auVar36._0_16_;
      auVar37._16_16_ = ZEXT116(0) * auVar36._16_16_ + ZEXT116(1) * auVar15._0_16_;
      auVar33 = vpsraw_avx2(auVar37,2);
      auVar36 = vperm2i128_avx2(auVar36,auVar15,0x31);
      auVar36 = vpsraw_avx2(auVar36,2);
      *(undefined1 (*) [32])im_block = auVar33;
      *(undefined1 (*) [32])((long)im_block + 0x20) = auVar36;
      im_block = (int16_t *)((long)im_block + 0x40);
      pauVar2 = (undefined1 (*) [16])(*pauVar2 + src_stride * 2);
      h = h + -2;
    } while (h != 0);
    break;
  default:
    pauVar3 = (undefined1 (*) [32])(src + 0x65);
    auVar11._16_16_ = _DAT_0050da40;
    auVar11._0_16_ = _DAT_0050da40;
    auVar16._16_16_ = _DAT_0050d620;
    auVar16._0_16_ = _DAT_0050d620;
    auVar19._16_16_ = _DAT_0050d630;
    auVar19._0_16_ = _DAT_0050d630;
    auVar24._16_16_ = _DAT_0050e470;
    auVar24._0_16_ = _DAT_0050e470;
    auVar29._8_2_ = 2;
    auVar29._0_8_ = 0x2000200020002;
    auVar29._10_2_ = 2;
    auVar29._12_2_ = 2;
    auVar29._14_2_ = 2;
    auVar29._16_2_ = 2;
    auVar29._18_2_ = 2;
    auVar29._20_2_ = 2;
    auVar29._22_2_ = 2;
    auVar29._24_2_ = 2;
    auVar29._26_2_ = 2;
    auVar29._28_2_ = 2;
    auVar29._30_2_ = 2;
    do {
      auVar36 = *(undefined1 (*) [32])(pauVar3[-4] + 0x18);
      auVar15 = pauVar3[-3];
      auVar33 = vpshufb_avx2(auVar36,auVar11);
      auVar23 = vpshufb_avx2(auVar36,auVar16);
      auVar28 = vpshufb_avx2(auVar36,auVar19);
      auVar35 = vpshufb_avx2(auVar36,auVar24);
      auVar36 = vpmaddubsw_avx2(auVar33,auVar4);
      auVar33 = vpmaddubsw_avx2(auVar23,auVar5);
      auVar36 = vpaddw_avx2(auVar36,auVar33);
      auVar33 = vpmaddubsw_avx2(auVar28,auVar6);
      auVar23 = vpmaddubsw_avx2(auVar35,auVar8);
      auVar33 = vpaddw_avx2(auVar33,auVar23);
      auVar36 = vpaddw_avx2(auVar36,auVar33);
      auVar33 = vpshufb_avx2(auVar15,auVar11);
      auVar23 = vpshufb_avx2(auVar15,auVar16);
      auVar28 = vpshufb_avx2(auVar15,auVar19);
      auVar35 = vpshufb_avx2(auVar15,auVar24);
      auVar15 = vpmaddubsw_avx2(auVar33,auVar4);
      auVar33 = vpmaddubsw_avx2(auVar23,auVar5);
      auVar15 = vpaddw_avx2(auVar15,auVar33);
      auVar33 = vpmaddubsw_avx2(auVar28,auVar6);
      auVar23 = vpmaddubsw_avx2(auVar35,auVar8);
      auVar33 = vpaddw_avx2(auVar33,auVar23);
      auVar15 = vpaddw_avx2(auVar15,auVar33);
      auVar36 = vpaddw_avx2(auVar36,auVar29);
      auVar33 = vpsraw_avx2(auVar36,2);
      auVar36 = vpaddw_avx2(auVar15,auVar29);
      auVar36 = vpsraw_avx2(auVar36,2);
      *(undefined1 (*) [32])im_block = auVar33;
      *(undefined1 (*) [32])((long)im_block + 0x20) = auVar36;
      auVar36 = *(undefined1 (*) [32])(pauVar3[-3] + 0x18);
      auVar15 = pauVar3[-2];
      auVar33 = vpshufb_avx2(auVar36,auVar11);
      auVar23 = vpshufb_avx2(auVar36,auVar16);
      auVar28 = vpshufb_avx2(auVar36,auVar19);
      auVar35 = vpshufb_avx2(auVar36,auVar24);
      auVar36 = vpmaddubsw_avx2(auVar33,auVar4);
      auVar33 = vpmaddubsw_avx2(auVar23,auVar5);
      auVar36 = vpaddw_avx2(auVar36,auVar33);
      auVar33 = vpmaddubsw_avx2(auVar28,auVar6);
      auVar23 = vpmaddubsw_avx2(auVar35,auVar8);
      auVar33 = vpaddw_avx2(auVar33,auVar23);
      auVar36 = vpaddw_avx2(auVar36,auVar33);
      auVar33 = vpshufb_avx2(auVar15,auVar11);
      auVar23 = vpshufb_avx2(auVar15,auVar16);
      auVar28 = vpshufb_avx2(auVar15,auVar19);
      auVar35 = vpshufb_avx2(auVar15,auVar24);
      auVar15 = vpmaddubsw_avx2(auVar33,auVar4);
      auVar33 = vpmaddubsw_avx2(auVar23,auVar5);
      auVar15 = vpaddw_avx2(auVar15,auVar33);
      auVar33 = vpmaddubsw_avx2(auVar28,auVar6);
      auVar23 = vpmaddubsw_avx2(auVar35,auVar8);
      auVar33 = vpaddw_avx2(auVar33,auVar23);
      auVar15 = vpaddw_avx2(auVar15,auVar33);
      auVar36 = vpaddw_avx2(auVar36,auVar29);
      auVar33 = vpsraw_avx2(auVar36,2);
      auVar36 = vpaddw_avx2(auVar15,auVar29);
      auVar36 = vpsraw_avx2(auVar36,2);
      *(undefined1 (*) [32])((long)im_block + 0x40) = auVar33;
      *(undefined1 (*) [32])((long)im_block + 0x60) = auVar36;
      auVar36 = *(undefined1 (*) [32])(pauVar3[-2] + 0x18);
      auVar15 = pauVar3[-1];
      auVar33 = vpshufb_avx2(auVar36,auVar11);
      auVar23 = vpshufb_avx2(auVar36,auVar16);
      auVar28 = vpshufb_avx2(auVar36,auVar19);
      auVar35 = vpshufb_avx2(auVar36,auVar24);
      auVar36 = vpmaddubsw_avx2(auVar33,auVar4);
      auVar33 = vpmaddubsw_avx2(auVar23,auVar5);
      auVar36 = vpaddw_avx2(auVar36,auVar33);
      auVar33 = vpmaddubsw_avx2(auVar28,auVar6);
      auVar23 = vpmaddubsw_avx2(auVar35,auVar8);
      auVar33 = vpaddw_avx2(auVar33,auVar23);
      auVar36 = vpaddw_avx2(auVar36,auVar33);
      auVar33 = vpshufb_avx2(auVar15,auVar11);
      auVar23 = vpshufb_avx2(auVar15,auVar16);
      auVar28 = vpshufb_avx2(auVar15,auVar19);
      auVar35 = vpshufb_avx2(auVar15,auVar24);
      auVar15 = vpmaddubsw_avx2(auVar33,auVar4);
      auVar33 = vpmaddubsw_avx2(auVar23,auVar5);
      auVar15 = vpaddw_avx2(auVar15,auVar33);
      auVar33 = vpmaddubsw_avx2(auVar28,auVar6);
      auVar23 = vpmaddubsw_avx2(auVar35,auVar8);
      auVar33 = vpaddw_avx2(auVar33,auVar23);
      auVar15 = vpaddw_avx2(auVar15,auVar33);
      auVar36 = vpaddw_avx2(auVar36,auVar29);
      auVar33 = vpsraw_avx2(auVar36,2);
      auVar36 = vpaddw_avx2(auVar15,auVar29);
      auVar36 = vpsraw_avx2(auVar36,2);
      *(undefined1 (*) [32])((long)im_block + 0x80) = auVar33;
      *(undefined1 (*) [32])((long)im_block + 0xa0) = auVar36;
      auVar36 = *(undefined1 (*) [32])(pauVar3[-1] + 0x18);
      auVar15 = *pauVar3;
      auVar33 = vpshufb_avx2(auVar36,auVar11);
      auVar23 = vpshufb_avx2(auVar36,auVar16);
      auVar28 = vpshufb_avx2(auVar36,auVar19);
      auVar35 = vpshufb_avx2(auVar36,auVar24);
      auVar36 = vpmaddubsw_avx2(auVar33,auVar4);
      auVar33 = vpmaddubsw_avx2(auVar23,auVar5);
      auVar36 = vpaddw_avx2(auVar36,auVar33);
      auVar33 = vpmaddubsw_avx2(auVar28,auVar6);
      auVar23 = vpmaddubsw_avx2(auVar35,auVar8);
      auVar33 = vpaddw_avx2(auVar33,auVar23);
      auVar36 = vpaddw_avx2(auVar36,auVar33);
      auVar33 = vpshufb_avx2(auVar15,auVar11);
      auVar23 = vpshufb_avx2(auVar15,auVar16);
      auVar28 = vpshufb_avx2(auVar15,auVar19);
      auVar35 = vpshufb_avx2(auVar15,auVar24);
      auVar15 = vpmaddubsw_avx2(auVar33,auVar4);
      auVar33 = vpmaddubsw_avx2(auVar23,auVar5);
      auVar15 = vpaddw_avx2(auVar15,auVar33);
      auVar33 = vpmaddubsw_avx2(auVar28,auVar6);
      auVar23 = vpmaddubsw_avx2(auVar35,auVar8);
      auVar33 = vpaddw_avx2(auVar33,auVar23);
      auVar15 = vpaddw_avx2(auVar15,auVar33);
      auVar36 = vpaddw_avx2(auVar36,auVar29);
      auVar33 = vpsraw_avx2(auVar36,2);
      auVar36 = vpaddw_avx2(auVar15,auVar29);
      auVar36 = vpsraw_avx2(auVar36,2);
      *(undefined1 (*) [32])((long)im_block + 0xc0) = auVar33;
      *(undefined1 (*) [32])((long)im_block + 0xe0) = auVar36;
      im_block = (int16_t *)((long)im_block + 0x100);
      pauVar3 = (undefined1 (*) [32])(*pauVar3 + src_stride);
      h = h + -1;
    } while (h != 0);
    break;
  case 3:
    pauVar3 = (undefined1 (*) [32])(src + 5);
    auVar35._16_16_ = _DAT_0050da40;
    auVar35._0_16_ = _DAT_0050da40;
    auVar13._16_16_ = _DAT_0050d620;
    auVar13._0_16_ = _DAT_0050d620;
    auVar32._16_16_ = _DAT_0050d630;
    auVar32._0_16_ = _DAT_0050d630;
    auVar21._16_16_ = _DAT_0050e470;
    auVar21._0_16_ = _DAT_0050e470;
    auVar26._8_2_ = 2;
    auVar26._0_8_ = 0x2000200020002;
    auVar26._10_2_ = 2;
    auVar26._12_2_ = 2;
    auVar26._14_2_ = 2;
    auVar26._16_2_ = 2;
    auVar26._18_2_ = 2;
    auVar26._20_2_ = 2;
    auVar26._22_2_ = 2;
    auVar26._24_2_ = 2;
    auVar26._26_2_ = 2;
    auVar26._28_2_ = 2;
    auVar26._30_2_ = 2;
    do {
      auVar36 = *(undefined1 (*) [32])(pauVar3[-1] + 0x18);
      auVar15 = *pauVar3;
      auVar33 = vpshufb_avx2(auVar36,auVar35);
      auVar23 = vpshufb_avx2(auVar36,auVar13);
      auVar28 = vpshufb_avx2(auVar36,auVar32);
      auVar11 = vpshufb_avx2(auVar36,auVar21);
      auVar36 = vpmaddubsw_avx2(auVar33,auVar4);
      auVar33 = vpmaddubsw_avx2(auVar23,auVar5);
      auVar36 = vpaddw_avx2(auVar36,auVar33);
      auVar33 = vpmaddubsw_avx2(auVar28,auVar6);
      auVar23 = vpmaddubsw_avx2(auVar11,auVar8);
      auVar33 = vpaddw_avx2(auVar33,auVar23);
      auVar36 = vpaddw_avx2(auVar36,auVar33);
      auVar33 = vpshufb_avx2(auVar15,auVar35);
      auVar23 = vpshufb_avx2(auVar15,auVar13);
      auVar28 = vpshufb_avx2(auVar15,auVar32);
      auVar11 = vpshufb_avx2(auVar15,auVar21);
      auVar15 = vpmaddubsw_avx2(auVar33,auVar4);
      auVar33 = vpmaddubsw_avx2(auVar23,auVar5);
      auVar15 = vpaddw_avx2(auVar15,auVar33);
      auVar33 = vpmaddubsw_avx2(auVar28,auVar6);
      auVar23 = vpmaddubsw_avx2(auVar11,auVar8);
      auVar33 = vpaddw_avx2(auVar33,auVar23);
      auVar15 = vpaddw_avx2(auVar15,auVar33);
      auVar36 = vpaddw_avx2(auVar36,auVar26);
      auVar33 = vpsraw_avx2(auVar36,2);
      auVar36 = vpaddw_avx2(auVar15,auVar26);
      auVar36 = vpsraw_avx2(auVar36,2);
      *(undefined1 (*) [32])im_block = auVar33;
      *(undefined1 (*) [32])((long)im_block + 0x20) = auVar36;
      im_block = (int16_t *)((long)im_block + 0x40);
      pauVar3 = (undefined1 (*) [32])(*pauVar3 + src_stride);
      h = h + -1;
    } while (h != 0);
    break;
  case 7:
    pauVar3 = (undefined1 (*) [32])(src + 0x25);
    auVar36._16_16_ = _DAT_0050da40;
    auVar36._0_16_ = _DAT_0050da40;
    auVar15._16_16_ = _DAT_0050d620;
    auVar15._0_16_ = _DAT_0050d620;
    auVar33._16_16_ = _DAT_0050d630;
    auVar33._0_16_ = _DAT_0050d630;
    auVar23._16_16_ = _DAT_0050e470;
    auVar23._0_16_ = _DAT_0050e470;
    auVar28._8_2_ = 2;
    auVar28._0_8_ = 0x2000200020002;
    auVar28._10_2_ = 2;
    auVar28._12_2_ = 2;
    auVar28._14_2_ = 2;
    auVar28._16_2_ = 2;
    auVar28._18_2_ = 2;
    auVar28._20_2_ = 2;
    auVar28._22_2_ = 2;
    auVar28._24_2_ = 2;
    auVar28._26_2_ = 2;
    auVar28._28_2_ = 2;
    auVar28._30_2_ = 2;
    do {
      auVar35 = *(undefined1 (*) [32])(pauVar3[-2] + 0x18);
      auVar13 = pauVar3[-1];
      auVar32 = vpshufb_avx2(auVar35,auVar36);
      auVar21 = vpshufb_avx2(auVar35,auVar15);
      auVar26 = vpshufb_avx2(auVar35,auVar33);
      auVar11 = vpshufb_avx2(auVar35,auVar23);
      auVar35 = vpmaddubsw_avx2(auVar32,auVar4);
      auVar32 = vpmaddubsw_avx2(auVar21,auVar5);
      auVar35 = vpaddw_avx2(auVar35,auVar32);
      auVar32 = vpmaddubsw_avx2(auVar26,auVar6);
      auVar21 = vpmaddubsw_avx2(auVar11,auVar8);
      auVar32 = vpaddw_avx2(auVar32,auVar21);
      auVar35 = vpaddw_avx2(auVar35,auVar32);
      auVar32 = vpshufb_avx2(auVar13,auVar36);
      auVar21 = vpshufb_avx2(auVar13,auVar15);
      auVar26 = vpshufb_avx2(auVar13,auVar33);
      auVar11 = vpshufb_avx2(auVar13,auVar23);
      auVar13 = vpmaddubsw_avx2(auVar32,auVar4);
      auVar32 = vpmaddubsw_avx2(auVar21,auVar5);
      auVar13 = vpaddw_avx2(auVar13,auVar32);
      auVar32 = vpmaddubsw_avx2(auVar26,auVar6);
      auVar21 = vpmaddubsw_avx2(auVar11,auVar8);
      auVar32 = vpaddw_avx2(auVar32,auVar21);
      auVar13 = vpaddw_avx2(auVar13,auVar32);
      auVar35 = vpaddw_avx2(auVar35,auVar28);
      auVar32 = vpsraw_avx2(auVar35,2);
      auVar35 = vpaddw_avx2(auVar13,auVar28);
      auVar35 = vpsraw_avx2(auVar35,2);
      *(undefined1 (*) [32])im_block = auVar32;
      *(undefined1 (*) [32])((long)im_block + 0x20) = auVar35;
      auVar35 = *(undefined1 (*) [32])(pauVar3[-1] + 0x18);
      auVar13 = *pauVar3;
      auVar32 = vpshufb_avx2(auVar35,auVar36);
      auVar21 = vpshufb_avx2(auVar35,auVar15);
      auVar26 = vpshufb_avx2(auVar35,auVar33);
      auVar11 = vpshufb_avx2(auVar35,auVar23);
      auVar35 = vpmaddubsw_avx2(auVar32,auVar4);
      auVar32 = vpmaddubsw_avx2(auVar21,auVar5);
      auVar35 = vpaddw_avx2(auVar35,auVar32);
      auVar32 = vpmaddubsw_avx2(auVar26,auVar6);
      auVar21 = vpmaddubsw_avx2(auVar11,auVar8);
      auVar32 = vpaddw_avx2(auVar32,auVar21);
      auVar35 = vpaddw_avx2(auVar35,auVar32);
      auVar32 = vpshufb_avx2(auVar13,auVar36);
      auVar21 = vpshufb_avx2(auVar13,auVar15);
      auVar26 = vpshufb_avx2(auVar13,auVar33);
      auVar11 = vpshufb_avx2(auVar13,auVar23);
      auVar13 = vpmaddubsw_avx2(auVar32,auVar4);
      auVar32 = vpmaddubsw_avx2(auVar21,auVar5);
      auVar13 = vpaddw_avx2(auVar13,auVar32);
      auVar32 = vpmaddubsw_avx2(auVar26,auVar6);
      auVar21 = vpmaddubsw_avx2(auVar11,auVar8);
      auVar32 = vpaddw_avx2(auVar32,auVar21);
      auVar13 = vpaddw_avx2(auVar13,auVar32);
      auVar35 = vpaddw_avx2(auVar35,auVar28);
      auVar32 = vpsraw_avx2(auVar35,2);
      auVar35 = vpaddw_avx2(auVar13,auVar28);
      auVar35 = vpsraw_avx2(auVar35,2);
      *(undefined1 (*) [32])((long)im_block + 0x40) = auVar32;
      *(undefined1 (*) [32])((long)im_block + 0x60) = auVar35;
      im_block = (int16_t *)((long)im_block + 0x80);
      pauVar3 = (undefined1 (*) [32])(*pauVar3 + src_stride);
      h = h + -1;
    } while (h != 0);
  }
  return;
}

Assistant:

static void convolve_2d_sr_hor_8tap_avx2(
    const uint8_t *const src, const int32_t src_stride, const int32_t w,
    const int32_t h, const InterpFilterParams *const filter_params_x,
    const int32_t subpel_x_q4, int16_t *const im_block) {
  const uint8_t *src_ptr = src - 3;
  int32_t y = h;
  int16_t *im = im_block;
  __m256i coeffs_256[4], filt_256[4];

  filt_256[0] = _mm256_loadu_si256((__m256i const *)filt1_global_avx2);
  filt_256[1] = _mm256_loadu_si256((__m256i const *)filt2_global_avx2);
  filt_256[2] = _mm256_loadu_si256((__m256i const *)filt3_global_avx2);
  filt_256[3] = _mm256_loadu_si256((__m256i const *)filt4_global_avx2);

  prepare_half_coeffs_8tap_avx2(filter_params_x, subpel_x_q4, coeffs_256);

  if (w == 8) {
    do {
      const __m256i res =
          x_convolve_8tap_8x2_avx2(src_ptr, src_stride, coeffs_256, filt_256);
      xy_x_round_store_8x2_avx2(res, im);
      src_ptr += 2 * src_stride;
      im += 2 * 8;
      y -= 2;
    } while (y);
  } else if (w == 16) {
    do {
      __m256i r[2];

      x_convolve_8tap_16x2_avx2(src_ptr, src_stride, coeffs_256, filt_256, r);
      xy_x_round_store_32_avx2(r, im);
      src_ptr += 2 * src_stride;
      im += 2 * 16;
      y -= 2;
    } while (y);
  } else if (w == 32) {
    do {
      xy_x_8tap_32_avx2(src_ptr, coeffs_256, filt_256, im);
      src_ptr += src_stride;
      im += 32;
    } while (--y);
  } else if (w == 64) {
    do {
      xy_x_8tap_32_avx2(src_ptr, coeffs_256, filt_256, im);
      xy_x_8tap_32_avx2(src_ptr + 32, coeffs_256, filt_256, im + 32);
      src_ptr += src_stride;
      im += 64;
    } while (--y);
  } else {
    assert(w == 128);

    do {
      xy_x_8tap_32_avx2(src_ptr, coeffs_256, filt_256, im);
      xy_x_8tap_32_avx2(src_ptr + 32, coeffs_256, filt_256, im + 32);
      xy_x_8tap_32_avx2(src_ptr + 64, coeffs_256, filt_256, im + 64);
      xy_x_8tap_32_avx2(src_ptr + 96, coeffs_256, filt_256, im + 96);
      src_ptr += src_stride;
      im += 128;
    } while (--y);
  }
}